

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_ild.c
# Opt level: O2

void resolve_vex_pp(pt_ild *ild,uint8_t pp)

{
  undefined3 in_register_00000031;
  int iVar1;
  
  iVar1 = CONCAT31(in_register_00000031,pp);
  if (iVar1 == 3) {
    *(ushort *)&ild->field_0x10 = (ushort)*(undefined4 *)&ild->field_0x10 & 0xff8f | 0x50;
  }
  else {
    if (iVar1 == 2) {
      ild->field_0x10 = ild->field_0x10 | 0x68;
      return;
    }
    if (iVar1 == 1) {
      ild->field_0x10 = ild->field_0x10 | 1;
      return;
    }
  }
  return;
}

Assistant:

static void resolve_vex_pp(struct pt_ild *ild, uint8_t pp)
{
	switch (pp) {
	case 0x01:
		ild->osz = 1;
		break;

	case 0x02:
		ild->f3 = 1;
		ild->last_f2f3 = 3;
		break;

	case 0x03:
		ild->f2 = 1;
		ild->last_f2f3 = 2;
		break;
	}
}